

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh.c
# Opt level: O1

void ssh_check_frozen(Ssh *ssh)

{
  _Bool _Var1;
  size_t sVar2;
  _Bool _Var3;
  
  if (ssh->s != (Socket *)0x0) {
    _Var1 = ssh->socket_frozen;
    _Var3 = true;
    if (ssh->logically_frozen == false) {
      sVar2 = bufchain_size(&ssh->in_raw);
      _Var3 = 0x8000 < sVar2;
    }
    ssh->socket_frozen = _Var3;
    (*ssh->s->vt->set_frozen)(ssh->s,_Var3);
    if (((_Var1 != false) && (ssh->socket_frozen == false)) &&
       (ssh->bpp != (BinaryPacketProtocol *)0x0)) {
      queue_idempotent_callback(&ssh->bpp->ic_in_raw);
      return;
    }
  }
  return;
}

Assistant:

void ssh_check_frozen(Ssh *ssh)
{
    if (!ssh->s)
        return;

    bool prev_frozen = ssh->socket_frozen;
    ssh->socket_frozen = (ssh->logically_frozen ||
                          bufchain_size(&ssh->in_raw) > SSH_MAX_BACKLOG);
    sk_set_frozen(ssh->s, ssh->socket_frozen);
    if (prev_frozen && !ssh->socket_frozen && ssh->bpp) {
        /*
         * If we've just unfrozen, process any SSH connection data
         * that was stashed in our queue while we were frozen.
         */
        queue_idempotent_callback(&ssh->bpp->ic_in_raw);
    }
}